

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

bool __thiscall haVoc::QMoveorder::valid_qmove(QMoveorder *this,Move *m)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((this->super_Moveorder).m_incheck == false) {
    if (m->type < 0xd) {
      bVar1 = (byte)(0x18f0 >> (m->type & 0x1f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QMoveorder::valid_qmove(const Move& m) {
		return m_incheck ||
			m.type == Movetype::capture ||
			m.type == Movetype::ep ||
			m.type == Movetype::capture_promotion_q ||
			m.type == Movetype::capture_promotion_r ||
			m.type == Movetype::capture_promotion_b ||
			m.type == Movetype::capture_promotion_n;
	}